

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandTrim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Ntk_t *pNtk;
  Aig_Man_t *pAVar2;
  Gia_Man_t *p;
  Gia_Man_t *p_00;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"Nh");
  if (iVar1 == -1) {
    if (pNtk == (Abc_Ntk_t *)0x0) {
      pcVar3 = "Empty network.\n";
    }
    else {
      if (pNtk->ntkType == ABC_NTK_STRASH) {
        pAVar2 = Abc_NtkToDar(pNtk,0,1);
        p = Gia_ManFromAigSimple(pAVar2);
        Aig_ManStop(pAVar2);
        p_00 = Gia_ManDupTrimmed(p,1,1,0,-1);
        Gia_ManStop(p);
        pAVar2 = Gia_ManToAigSimple(p_00);
        Gia_ManStop(p_00);
        pNtk_00 = Abc_NtkFromAigPhase(pAVar2);
        Aig_ManStop(pAVar2);
        if (pNtk_00->pName != (char *)0x0) {
          free(pNtk_00->pName);
          pNtk_00->pName = (char *)0x0;
        }
        if (pNtk_00->pSpec != (char *)0x0) {
          free(pNtk_00->pSpec);
          pNtk_00->pSpec = (char *)0x0;
        }
        pcVar3 = Extra_UtilStrsav(pNtk->pName);
        pNtk_00->pName = pcVar3;
        pcVar3 = Extra_UtilStrsav(pNtk->pSpec);
        pNtk_00->pSpec = pcVar3;
        Abc_FrameReplaceCurrentNetwork(pAbc,pNtk_00);
        return 0;
      }
      pcVar3 = "Trimming works only for AIGs (run \"strash\").\n";
    }
    iVar1 = -1;
  }
  else {
    iVar1 = -2;
    Abc_Print(-2,"usage: trim [-h]\n");
    Abc_Print(-2,"\t         removes POs fed by constants and PIs w/o fanout\n");
    pcVar3 = "\t-h     : print the command usage\n";
  }
  Abc_Print(iVar1,pcVar3);
  return 1;
}

Assistant:

int Abc_CommandTrim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    Gia_Man_t * pGia, * pNew;
    Aig_Man_t * pAig;
    int c;
    pNtk = Abc_FrameReadNtk(pAbc);
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "Trimming works only for AIGs (run \"strash\").\n" );
        return 1;
    }
    // convert to GIA
    pAig = Abc_NtkToDar( pNtk, 0, 1 );
    pGia = Gia_ManFromAigSimple( pAig );
    Aig_ManStop( pAig );
    // perform trimming
    pNew = Gia_ManDupTrimmed( pGia, 1, 1, 0, -1 );
    Gia_ManStop( pGia );
    // convert back
    pAig = Gia_ManToAigSimple( pNew );
    Gia_ManStop( pNew );
    pNtkRes = Abc_NtkFromAigPhase( pAig );
    Aig_ManStop( pAig );
    // duplicate the name and the spec
    ABC_FREE( pNtkRes->pName );
    ABC_FREE( pNtkRes->pSpec );
    pNtkRes->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkRes->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: trim [-h]\n" );
    Abc_Print( -2, "\t         removes POs fed by constants and PIs w/o fanout\n" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}